

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

bool __thiscall
CKey::SignSchnorr(CKey *this,uint256 *hash,Span<unsigned_char> sig,uint256 *merkle_root,uint256 *aux
                 )

{
  bool bVar1;
  long in_FS_OFFSET;
  KeyPair kp;
  unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  KeyPair::KeyPair((KeyPair *)&uStack_38,this,merkle_root);
  bVar1 = KeyPair::SignSchnorr((KeyPair *)&uStack_38,hash,sig,aux);
  std::
  unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  ::~unique_ptr(&uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::SignSchnorr(const uint256& hash, Span<unsigned char> sig, const uint256* merkle_root, const uint256& aux) const
{
    KeyPair kp = ComputeKeyPair(merkle_root);
    return kp.SignSchnorr(hash, sig, aux);
}